

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void mulmod256(uint16_t *out,uint16_t *a,uint16_t *b,uint16_t *m)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int bitpos;
  int p;
  uint16_t sub;
  int64_t cs;
  uint16_t mul2 [32];
  int mul_bitlen;
  int m_bitlen;
  int j;
  int i;
  uint64_t c;
  uint16_t mul [32];
  int local_e0;
  int local_d8;
  ushort local_d2;
  long local_d0;
  undefined2 local_c8 [36];
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 auStack_48 [40];
  long local_20;
  undefined8 *local_8;
  
  local_70 = 0;
  local_7c = 0;
  local_80 = 0;
  local_20 = in_RCX;
  local_8 = in_RDI;
  if (in_RDX == 0) {
    local_68 = *in_RSI;
    local_60 = in_RSI[1];
    local_58 = in_RSI[2];
    local_50 = in_RSI[3];
    memset(auStack_48,0,0x20);
    for (local_74 = 0xff; -1 < local_74; local_74 = local_74 + -1) {
      if (((int)(uint)*(ushort *)((long)&local_68 + (long)(local_74 >> 4) * 2) >>
           ((byte)local_74 & 0xf) & 1U) != 0) {
        local_80 = local_74;
        break;
      }
    }
  }
  else {
    for (local_74 = 0; local_74 < 0x20; local_74 = local_74 + 1) {
      if (local_74 < 0x10) {
        local_e0 = 0;
      }
      else {
        local_e0 = local_74 + -0xf;
      }
      for (local_78 = local_e0; local_78 <= local_74 && local_78 < 0x10; local_78 = local_78 + 1) {
        local_70 = (ulong)*(ushort *)((long)in_RSI + (long)local_78 * 2) *
                   (ulong)*(ushort *)(in_RDX + (long)(local_74 - local_78) * 2) + local_70;
      }
      *(short *)((long)&local_68 + (long)local_74 * 2) = (short)local_70;
      local_70 = local_70 >> 0x10;
    }
    if (local_70 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
              ,0x2f6,"test condition failed: c == 0");
      abort();
    }
    for (local_74 = 0x1ff; -1 < local_74; local_74 = local_74 + -1) {
      if (((int)(uint)*(ushort *)((long)&local_68 + (long)(local_74 >> 4) * 2) >>
           ((byte)local_74 & 0xf) & 1U) != 0) {
        local_80 = local_74;
        break;
      }
    }
  }
  if (local_20 != 0) {
    for (local_74 = 0xff; -1 < local_74; local_74 = local_74 + -1) {
      if (((int)(uint)*(ushort *)(local_20 + (long)(local_74 >> 4) * 2) >> ((byte)local_74 & 0xf) &
          1U) != 0) {
        local_7c = local_74;
        break;
      }
    }
    for (local_74 = local_80 - local_7c; -1 < local_74; local_74 = local_74 + -1) {
      local_d0 = 0;
      for (local_78 = 0; local_78 < 0x20; local_78 = local_78 + 1) {
        local_d2 = 0;
        for (local_d8 = 0; local_d8 < 0x10; local_d8 = local_d8 + 1) {
          iVar1 = (local_78 * 0x10 - local_74) + local_d8;
          if ((-1 < iVar1) && (iVar1 < 0x100)) {
            local_d2 = local_d2 |
                       (ushort)(((int)(uint)*(ushort *)(local_20 + (long)(iVar1 >> 4) * 2) >>
                                 ((byte)iVar1 & 0xf) & 1U) << ((byte)local_d8 & 0x1f));
          }
        }
        local_d0 = ((ulong)*(ushort *)((long)&local_68 + (long)local_78 * 2) + local_d0) -
                   (ulong)local_d2;
        local_c8[local_78] = (short)local_d0;
        local_d0 = local_d0 >> 0x10;
      }
      if (local_d0 == 0) {
        memcpy(&local_68,local_c8,0x40);
      }
    }
    local_74 = local_7c >> 4;
    while (local_74 = local_74 + 1, local_74 < 0x20) {
      if (*(short *)((long)&local_68 + (long)local_74 * 2) != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
                ,0x333,"test condition failed: mul[i] == 0");
        abort();
      }
    }
  }
  *local_8 = local_68;
  local_8[1] = local_60;
  local_8[2] = local_58;
  local_8[3] = local_50;
  return;
}

Assistant:

static void mulmod256(uint16_t* out, const uint16_t* a, const uint16_t* b, const uint16_t* m) {
    uint16_t mul[32];
    uint64_t c = 0;
    int i, j;
    int m_bitlen = 0;
    int mul_bitlen = 0;

    if (b != NULL) {
        /* Compute the product of a and b, and put it in mul. */
        for (i = 0; i < 32; ++i) {
            for (j = i <= 15 ? 0 : i - 15; j <= i && j <= 15; j++) {
                c += (uint64_t)a[j] * b[i - j];
            }
            mul[i] = c & 0xFFFF;
            c >>= 16;
        }
        CHECK(c == 0);

        /* compute the highest set bit in mul */
        for (i = 511; i >= 0; --i) {
            if ((mul[i >> 4] >> (i & 15)) & 1) {
                mul_bitlen = i;
                break;
            }
        }
    } else {
        /* if b==NULL, set mul=a. */
        memcpy(mul, a, 32);
        memset(mul + 16, 0, 32);
        /* compute the highest set bit in mul */
        for (i = 255; i >= 0; --i) {
            if ((mul[i >> 4] >> (i & 15)) & 1) {
                mul_bitlen = i;
                break;
            }
        }
    }

    if (m) {
        /* Compute the highest set bit in m. */
        for (i = 255; i >= 0; --i) {
            if ((m[i >> 4] >> (i & 15)) & 1) {
                m_bitlen = i;
                break;
            }
        }

        /* Try do mul -= m<<i, for i going down to 0, whenever the result is not negative */
        for (i = mul_bitlen - m_bitlen; i >= 0; --i) {
            uint16_t mul2[32];
            int64_t cs;

            /* Compute mul2 = mul - m<<i. */
            cs = 0; /* accumulator */
            for (j = 0; j < 32; ++j) { /* j loops over the output limbs in mul2. */
                /* Compute sub: the 16 bits in m that will be subtracted from mul2[j]. */
                uint16_t sub = 0;
                int p;
                for (p = 0; p < 16; ++p) { /* p loops over the bit positions in mul2[j]. */
                    int bitpos = j * 16 - i + p; /* bitpos is the correspond bit position in m. */
                    if (bitpos >= 0 && bitpos < 256) {
                        sub |= ((m[bitpos >> 4] >> (bitpos & 15)) & 1) << p;
                    }
                }
                /* Add mul[j]-sub to accumulator, and shift bottom 16 bits out to mul2[j]. */
                cs += mul[j];
                cs -= sub;
                mul2[j] = (cs & 0xFFFF);
                cs >>= 16;
            }
            /* If remainder of subtraction is 0, set mul = mul2. */
            if (cs == 0) {
                memcpy(mul, mul2, sizeof(mul));
            }
        }
        /* Sanity check: test that all limbs higher than m's highest are zero */
        for (i = (m_bitlen >> 4) + 1; i < 32; ++i) {
            CHECK(mul[i] == 0);
        }
    }
    memcpy(out, mul, 32);
}